

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O1

void EVP_EncodeUpdate(EVP_ENCODE_CTX *ctx,uchar *out,int *outl,uchar *in,int inl)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 in_register_00000084;
  size_t __n;
  bool bVar5;
  long lVar3;
  
  *outl = 0;
  if (CONCAT44(in_register_00000084,inl) != 0) {
    uVar2 = (ulong)(uint)ctx->num;
    if (0x2f < uVar2) {
      __assert_fail("ctx->data_used < sizeof(ctx->data)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64.cc"
                    ,0x65,
                    "void EVP_EncodeUpdate(EVP_ENCODE_CTX *, uint8_t *, int *, const uint8_t *, size_t)"
                   );
    }
    __n = CONCAT44(in_register_00000084,inl);
    if (CONCAT44(in_register_00000084,inl) < 0x30 - uVar2) {
      memcpy(ctx->enc_data + (uVar2 - 4),in,__n);
    }
    if (uVar2 != 0) {
      memcpy(ctx->enc_data + (uVar2 - 4),in,0x30 - uVar2);
    }
    uVar2 = 0;
    do {
      if (__n < 0x30) {
        if (__n == 0) {
          ctx->num = 0;
          iVar1 = (int)uVar2;
          if (0x7fffffff < uVar2) {
            iVar1 = 0;
          }
          *outl = iVar1;
          return;
        }
        memcpy(&ctx->length,in,__n);
      }
      iVar1 = EVP_EncodeBlock(out,in,0x30);
      lVar3 = CONCAT44(extraout_var,iVar1);
      (out + lVar3)[0] = '\n';
      (out + lVar3)[1] = '\0';
      if (-lVar3 - 2U < uVar2) {
        *outl = 0;
        uVar4 = uVar2;
      }
      else {
        uVar4 = lVar3 + uVar2 + 1;
      }
      in = in + 0x30;
      out = out + lVar3 + 1;
      __n = __n - 0x30;
      bVar5 = uVar2 <= -lVar3 - 2U;
      uVar2 = uVar4;
    } while (bVar5);
  }
  return;
}

Assistant:

void EVP_EncodeUpdate(EVP_ENCODE_CTX *ctx, uint8_t *out, int *out_len,
                      const uint8_t *in, size_t in_len) {
  size_t total = 0;

  *out_len = 0;
  if (in_len == 0) {
    return;
  }

  assert(ctx->data_used < sizeof(ctx->data));

  if (sizeof(ctx->data) - ctx->data_used > in_len) {
    OPENSSL_memcpy(&ctx->data[ctx->data_used], in, in_len);
    ctx->data_used += (unsigned)in_len;
    return;
  }

  if (ctx->data_used != 0) {
    const size_t todo = sizeof(ctx->data) - ctx->data_used;
    OPENSSL_memcpy(&ctx->data[ctx->data_used], in, todo);
    in += todo;
    in_len -= todo;

    size_t encoded = EVP_EncodeBlock(out, ctx->data, sizeof(ctx->data));
    ctx->data_used = 0;

    out += encoded;
    *(out++) = '\n';
    *out = '\0';

    total = encoded + 1;
  }

  while (in_len >= sizeof(ctx->data)) {
    size_t encoded = EVP_EncodeBlock(out, in, sizeof(ctx->data));
    in += sizeof(ctx->data);
    in_len -= sizeof(ctx->data);

    out += encoded;
    *(out++) = '\n';
    *out = '\0';

    if (total + encoded + 1 < total) {
      *out_len = 0;
      return;
    }

    total += encoded + 1;
  }

  if (in_len != 0) {
    OPENSSL_memcpy(ctx->data, in, in_len);
  }

  ctx->data_used = (unsigned)in_len;

  if (total > INT_MAX) {
    // We cannot signal an error, but we can at least avoid making *out_len
    // negative.
    total = 0;
  }
  *out_len = (int)total;
}